

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_popup_end(nk_context *ctx)

{
  byte *pbVar1;
  nk_window *pnVar2;
  nk_window *pnVar3;
  nk_size nVar4;
  nk_buffer *pnVar5;
  nk_handle nVar6;
  nk_size nVar7;
  float fVar8;
  float fVar9;
  int iVar10;
  undefined4 uVar11;
  float fVar12;
  float fVar13;
  nk_panel *pnVar14;
  nk_rect r;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x4266,"void nk_popup_end(struct nk_context *)");
  }
  pnVar2 = ctx->current;
  if (pnVar2 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,16999,"void nk_popup_end(struct nk_context *)");
  }
  if (pnVar2->layout == (nk_panel *)0x0) {
    __assert_fail("ctx->current->layout",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,17000,"void nk_popup_end(struct nk_context *)");
  }
  pnVar3 = pnVar2->parent;
  if (pnVar3 != (nk_window *)0x0) {
    if ((pnVar2->flags & 0x2000) != 0) {
      for (pnVar14 = pnVar3->layout; pnVar14 != (nk_panel *)0x0; pnVar14 = pnVar14->parent) {
        pbVar1 = (byte *)((long)&pnVar14->flags + 2);
        *pbVar1 = *pbVar1 | 1;
      }
      (pnVar3->popup).active = 0;
    }
    r.w = 16384.0;
    r.h = 16384.0;
    r.x = -8192.0;
    r.y = -8192.0;
    nk_push_scissor(&pnVar2->buffer,r);
    nk_end(ctx);
    pnVar5 = (pnVar2->buffer).base;
    fVar12 = (pnVar2->buffer).clip.x;
    fVar13 = (pnVar2->buffer).clip.y;
    fVar8 = (pnVar2->buffer).clip.w;
    fVar9 = (pnVar2->buffer).clip.h;
    iVar10 = (pnVar2->buffer).use_clipping;
    uVar11 = *(undefined4 *)&(pnVar2->buffer).field_0x1c;
    nVar6 = (pnVar2->buffer).userdata;
    nVar4 = (pnVar2->buffer).begin;
    nVar7 = (pnVar2->buffer).last;
    (pnVar3->buffer).end = (pnVar2->buffer).end;
    (pnVar3->buffer).last = nVar7;
    (pnVar3->buffer).userdata = nVar6;
    (pnVar3->buffer).begin = nVar4;
    (pnVar3->buffer).clip.w = fVar8;
    (pnVar3->buffer).clip.h = fVar9;
    (pnVar3->buffer).use_clipping = iVar10;
    *(undefined4 *)&(pnVar3->buffer).field_0x1c = uVar11;
    (pnVar3->buffer).base = pnVar5;
    (pnVar3->buffer).clip.x = fVar12;
    (pnVar3->buffer).clip.y = fVar13;
    nVar4 = (pnVar3->buffer).end;
    (pnVar3->popup).buf.last = (pnVar3->buffer).last;
    (pnVar3->popup).buf.end = nVar4;
    ctx->current = pnVar3;
    nk_push_scissor(&pnVar3->buffer,pnVar3->layout->clip);
    return;
  }
  return;
}

Assistant:

NK_API void
nk_popup_end(struct nk_context *ctx)
{
    struct nk_window *win;
    struct nk_window *popup;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current || !ctx->current->layout)
        return;

    popup = ctx->current;
    if (!popup->parent) return;
    win = popup->parent;
    if (popup->flags & NK_WINDOW_HIDDEN) {
        struct nk_panel *root;
        root = win->layout;
        while (root) {
            root->flags |= NK_WINDOW_REMOVE_ROM;
            root = root->parent;
        }
        win->popup.active = 0;
    }
    nk_push_scissor(&popup->buffer, nk_null_rect);
    nk_end(ctx);

    win->buffer = popup->buffer;
    nk_finish_popup(ctx, win);
    ctx->current = win;
    nk_push_scissor(&win->buffer, win->layout->clip);
}